

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O1

int Gia_ObjGetCnfVar(Gia_Man_t *pGia,int iObj,Vec_Ptr_t *vFrontier,Vec_Ptr_t *vFanins,satoko_t *pSat
                    )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int *piVar9;
  void **ppvVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  Gia_Obj_t *pObj;
  
  if ((iObj < 0) || (iVar8 = pGia->nObjs, iVar8 <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pObj = pGia->pObjs + (uint)iObj;
  if ((pGia->vCopies2).nSize < iVar8) {
    iVar1 = (pGia->vCopies2).nCap;
    iVar14 = iVar1 * 2;
    if (iVar14 < iVar8) {
      if (iVar1 < iVar8) {
        piVar9 = (pGia->vCopies2).pArray;
        if (piVar9 == (int *)0x0) {
          piVar9 = (int *)malloc((long)iVar8 << 2);
        }
        else {
          piVar9 = (int *)realloc(piVar9,(long)iVar8 << 2);
        }
        (pGia->vCopies2).pArray = piVar9;
        iVar14 = iVar8;
LAB_0064570f:
        if (piVar9 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pGia->vCopies2).nCap = iVar14;
      }
    }
    else if (iVar1 < iVar14 && iVar1 < iVar8) {
      piVar9 = (pGia->vCopies2).pArray;
      if (piVar9 == (int *)0x0) {
        piVar9 = (int *)malloc((long)iVar1 << 3);
      }
      else {
        piVar9 = (int *)realloc(piVar9,(long)iVar1 << 3);
      }
      (pGia->vCopies2).pArray = piVar9;
      goto LAB_0064570f;
    }
    uVar7 = (pGia->vCopies2).nSize;
    if ((int)uVar7 < iVar8) {
      memset((pGia->vCopies2).pArray + (int)uVar7,0xff,(ulong)(~uVar7 + iVar8) * 4 + 4);
    }
    (pGia->vCopies2).nSize = iVar8;
  }
  pGVar4 = pGia->pObjs;
  if ((pObj < pGVar4) || (pGVar4 + pGia->nObjs <= pObj)) goto LAB_00645d79;
  uVar7 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
  if (((int)uVar7 < 0) || ((pGia->vCopies2).nSize <= (int)uVar7)) {
LAB_00645d98:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar8 = (pGia->vCopies2).pArray[uVar7 & 0x7fffffff];
  if (iVar8 < 0) {
    if (iObj == 0) {
      __assert_fail("iObj > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                    ,0x14a,
                    "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)");
    }
    uVar7 = (uint)*(undefined8 *)pObj;
    if ((~uVar7 & 0x9fffffff) == 0) {
      iVar8 = satoko_add_variable(pSat,'\0');
      p = pGia->vVar2Obj;
      if (p != (Vec_Int_t *)0x0) {
        if (p->nSize != iVar8) {
          __assert_fail("Vec_IntSize(pGia->vVar2Obj) == iVar",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                        ,0x150,
                        "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                       );
        }
        Vec_IntPush(p,iObj);
      }
      pGVar4 = pGia->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + pGia->nObjs <= pObj)) {
LAB_00645d79:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar7 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar7 < 0) || ((pGia->vCopies2).nSize <= (int)uVar7)) goto LAB_00645d98;
      piVar9 = (pGia->vCopies2).pArray;
      if (piVar9[uVar7 & 0x7fffffff] != -1) {
        __assert_fail("Cec2_ObjSatId(p, pObj) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x4d,"int Cec2_ObjSetSatId(Gia_Man_t *, Gia_Obj_t *, int)");
      }
      piVar9[uVar7 & 0x7fffffff] = iVar8;
    }
    else {
      if (((int)uVar7 < 0) || ((uVar7 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                      ,0x155,
                      "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                     );
      }
      vFrontier->nSize = 0;
      Cec2_ObjAddToFrontier(pGia,pObj,vFrontier,pSat);
      if (0 < vFrontier->nSize) {
        lVar12 = 0;
        do {
          pGVar4 = (Gia_Obj_t *)vFrontier->pArray[lVar12];
          pGVar5 = pGia->pObjs;
          if ((pGVar4 < pGVar5) || (pGVar5 + pGia->nObjs <= pGVar4)) goto LAB_00645d79;
          uVar7 = (int)((long)pGVar4 - (long)pGVar5 >> 2) * -0x55555555;
          if (((int)uVar7 < 0) || ((pGia->vCopies2).nSize <= (int)uVar7)) goto LAB_00645d98;
          if ((pGia->vCopies2).pArray[uVar7 & 0x7fffffff] < 0) {
            __assert_fail("Cec2_ObjSatId(pGia,pNode) >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x15d,
                          "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                         );
          }
          if ((pGVar4->field_0x3 & 0x40) == 0) {
            Cec2_CollectSuper(pGia,pGVar4,1,vFanins);
            if (0 < vFanins->nSize) {
              lVar13 = 0;
              do {
                Cec2_ObjAddToFrontier
                          (pGia,(Gia_Obj_t *)((ulong)vFanins->pArray[lVar13] & 0xfffffffffffffffe),
                           vFrontier,pSat);
                lVar13 = lVar13 + 1;
              } while (lVar13 < vFanins->nSize);
            }
            Cec2_AddClausesSuper(pGia,pGVar4,vFanins,pSat);
          }
          else {
            vFanins->nSize = 0;
            uVar11 = *(ulong *)pGVar4;
            uVar6 = *(ulong *)(pGVar4 + -(uVar11 & 0x1fffffff));
            if (vFanins->nCap == 0) {
              if (vFanins->pArray == (void **)0x0) {
                ppvVar10 = (void **)malloc(0x80);
              }
              else {
                ppvVar10 = (void **)realloc(vFanins->pArray,0x80);
              }
              vFanins->pArray = ppvVar10;
              vFanins->nCap = 0x10;
            }
            iVar8 = vFanins->nSize;
            vFanins->nSize = iVar8 + 1;
            vFanins->pArray[iVar8] = pGVar4 + (-(uVar11 & 0x1fffffff) - (uVar6 & 0x1fffffff));
            pGVar5 = pGVar4 + -((ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
            uVar11 = *(ulong *)pGVar5;
            uVar7 = vFanins->nSize;
            if (0 < (long)(int)uVar7) {
              lVar13 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[lVar13] == pGVar5 + -(uVar11 & 0x1fffffff))
                goto LAB_00645b04;
                lVar13 = lVar13 + 1;
              } while ((int)uVar7 != lVar13);
            }
            uVar2 = vFanins->nCap;
            if (uVar7 == uVar2) {
              if ((int)uVar2 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar10;
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar2 * 2;
                if (iVar8 <= (int)uVar2) goto LAB_00645aee;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,(ulong)uVar2 << 4);
                }
                vFanins->pArray = ppvVar10;
              }
              vFanins->nCap = iVar8;
            }
LAB_00645aee:
            iVar8 = vFanins->nSize;
            vFanins->nSize = iVar8 + 1;
            vFanins->pArray[iVar8] = pGVar5 + -(uVar11 & 0x1fffffff);
LAB_00645b04:
            uVar11 = *(ulong *)pGVar4;
            uVar7 = *(uint *)&pGVar4[-(uVar11 & 0x1fffffff)].field_0x4;
            uVar2 = vFanins->nSize;
            if (0 < (long)(int)uVar2) {
              lVar13 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[lVar13] ==
                    pGVar4 + (-(uVar11 & 0x1fffffff) - ((ulong)uVar7 & 0x1fffffff)))
                goto LAB_00645bec;
                lVar13 = lVar13 + 1;
              } while ((int)uVar2 != lVar13);
            }
            uVar3 = vFanins->nCap;
            if (uVar2 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar10;
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar3 * 2;
                if (iVar8 <= (int)uVar3) goto LAB_00645bd6;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,(ulong)uVar3 << 4);
                }
                vFanins->pArray = ppvVar10;
              }
              vFanins->nCap = iVar8;
            }
LAB_00645bd6:
            iVar8 = vFanins->nSize;
            vFanins->nSize = iVar8 + 1;
            vFanins->pArray[iVar8] = pGVar4 + (-(uVar11 & 0x1fffffff) - ((ulong)uVar7 & 0x1fffffff))
            ;
LAB_00645bec:
            uVar11 = (ulong)*(uint *)&pGVar4->field_0x4 & 0x1fffffff;
            uVar7 = *(uint *)&pGVar4[-uVar11].field_0x4;
            uVar2 = vFanins->nSize;
            if (0 < (long)(int)uVar2) {
              lVar13 = 0;
              do {
                if ((Gia_Obj_t *)vFanins->pArray[lVar13] ==
                    pGVar4 + (-uVar11 - ((ulong)uVar7 & 0x1fffffff))) goto LAB_00645cb9;
                lVar13 = lVar13 + 1;
              } while ((int)uVar2 != lVar13);
            }
            uVar3 = vFanins->nCap;
            if (uVar2 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc(0x80);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,0x80);
                }
                vFanins->pArray = ppvVar10;
                iVar8 = 0x10;
              }
              else {
                iVar8 = uVar3 * 2;
                if (iVar8 <= (int)uVar3) goto LAB_00645ca3;
                if (vFanins->pArray == (void **)0x0) {
                  ppvVar10 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar10 = (void **)realloc(vFanins->pArray,(ulong)uVar3 << 4);
                }
                vFanins->pArray = ppvVar10;
              }
              vFanins->nCap = iVar8;
            }
LAB_00645ca3:
            iVar8 = vFanins->nSize;
            vFanins->nSize = iVar8 + 1;
            vFanins->pArray[iVar8] = pGVar4 + (-uVar11 - ((ulong)uVar7 & 0x1fffffff));
LAB_00645cb9:
            if (0 < vFanins->nSize) {
              lVar13 = 0;
              do {
                Cec2_ObjAddToFrontier
                          (pGia,(Gia_Obj_t *)((ulong)vFanins->pArray[lVar13] & 0xfffffffffffffffe),
                           vFrontier,pSat);
                lVar13 = lVar13 + 1;
              } while (lVar13 < vFanins->nSize);
            }
            Cec2_AddClausesMux(pGia,pGVar4,pSat);
          }
          if (vFanins->nSize < 2) {
            __assert_fail("Vec_PtrSize(vFanins) > 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecSat.c"
                          ,0x171,
                          "int Gia_ObjGetCnfVar(Gia_Man_t *, int, Vec_Ptr_t *, Vec_Ptr_t *, satoko_t *)"
                         );
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vFrontier->nSize);
      }
      pGVar4 = pGia->pObjs;
      if ((pObj < pGVar4) || (pGVar4 + pGia->nObjs <= pObj)) goto LAB_00645d79;
      uVar7 = (int)((long)pObj - (long)pGVar4 >> 2) * -0x55555555;
      if (((int)uVar7 < 0) || ((pGia->vCopies2).nSize <= (int)uVar7)) goto LAB_00645d98;
      iVar8 = (pGia->vCopies2).pArray[uVar7 & 0x7fffffff];
    }
  }
  return iVar8;
}

Assistant:

int Gia_ObjGetCnfVar( Gia_Man_t * pGia, int iObj, Vec_Ptr_t * vFrontier, Vec_Ptr_t * vFanins, satoko_t * pSat )
{ 
    Gia_Obj_t * pNode, * pFanin;
    Gia_Obj_t * pObj = Gia_ManObj(pGia, iObj);
    int i, k, fUseMuxes = 1;
    if ( Vec_IntSize(&pGia->vCopies2) < Gia_ManObjNum(pGia) )
        Vec_IntFillExtra( &pGia->vCopies2, Gia_ManObjNum(pGia), -1 );
    // quit if CNF is ready
    if ( Cec2_ObjSatId(pGia,pObj) >= 0 )
        return Cec2_ObjSatId(pGia,pObj);
    assert( iObj > 0 );
    if ( Gia_ObjIsCi(pObj) )
    {
        int iVar = satoko_add_variable(pSat, 0);
        if ( pGia->vVar2Obj )
        {
            assert( Vec_IntSize(pGia->vVar2Obj) == iVar );
            Vec_IntPush( pGia->vVar2Obj, iObj );
        }
        return Cec2_ObjSetSatId( pGia, pObj, iVar );
    }
    assert( Gia_ObjIsAnd(pObj) );
    // start the frontier
    Vec_PtrClear( vFrontier );
    Cec2_ObjAddToFrontier( pGia, pObj, vFrontier, pSat );
    // explore nodes in the frontier
    Vec_PtrForEachEntry( Gia_Obj_t *, vFrontier, pNode, i )
    {
        // create the supergate
        assert( Cec2_ObjSatId(pGia,pNode) >= 0 );
        if ( fUseMuxes && pNode->fMark0 )
        {
            Vec_PtrClear( vFanins );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin0( Gia_ObjFanin1(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin0(pNode) ) );
            Vec_PtrPushUnique( vFanins, Gia_ObjFanin1( Gia_ObjFanin1(pNode) ) );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesMux( pGia, pNode, pSat );
        }
        else
        {
            Cec2_CollectSuper( pGia, pNode, fUseMuxes, vFanins );
            Vec_PtrForEachEntry( Gia_Obj_t *, vFanins, pFanin, k )
                Cec2_ObjAddToFrontier( pGia, Gia_Regular(pFanin), vFrontier, pSat );
            Cec2_AddClausesSuper( pGia, pNode, vFanins, pSat ); 
            //printf( "%d ", Vec_PtrSize(vFanins) );
        }
        assert( Vec_PtrSize(vFanins) > 1 );
    }
    return Cec2_ObjSatId(pGia,pObj);
}